

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::to_swizzle_expression_abi_cxx11_(CompilerMSL *this,uint32_t id)

{
  uint32_t uVar1;
  SPIRCombinedImageSampler *pSVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 *puVar5;
  uint32_t in_EDX;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  string local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> array_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> image_expr;
  size_type period;
  size_type index;
  undefined1 local_48 [8];
  string expr;
  SPIRCombinedImageSampler *combined;
  uint32_t id_local;
  CompilerMSL *this_local;
  
  pSVar2 = Compiler::maybe_get<spirv_cross::SPIRCombinedImageSampler>
                     ((Compiler *)CONCAT44(in_register_00000034,id),in_EDX);
  if (pSVar2 == (SPIRCombinedImageSampler *)0x0) {
    TypedID<(spirv_cross::Types)2>::TypedID
              ((TypedID<(spirv_cross::Types)2> *)((long)&index + 4),in_EDX);
  }
  else {
    index._4_4_ = (pSVar2->image).id;
  }
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&index + 4));
  CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_48,id,SUB41(uVar1,0));
  uVar3 = ::std::__cxx11::string::find_first_of((char)local_48,0x5b);
  while (uVar4 = ::std::__cxx11::string::find_first_of((char)local_48,0x2e),
        uVar4 != 0xffffffffffffffff && uVar4 < uVar3) {
    puVar5 = (undefined1 *)::std::__cxx11::string::operator[]((ulong)local_48);
    *puVar5 = 0x5f;
  }
  if (uVar3 == 0xffffffffffffffff) {
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  }
  else {
    ::std::__cxx11::string::substr((ulong)local_90,(ulong)local_48);
    ::std::__cxx11::string::substr((ulong)local_b0,(ulong)local_48);
    ::std::operator+(local_d0,local_90);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     local_d0);
    ::std::__cxx11::string::~string((string *)local_d0);
    ::std::__cxx11::string::~string(local_b0);
    ::std::__cxx11::string::~string((string *)local_90);
  }
  ::std::__cxx11::string::~string((string *)local_48);
  return this;
}

Assistant:

string CompilerMSL::to_swizzle_expression(uint32_t id)
{
	auto *combined = maybe_get<SPIRCombinedImageSampler>(id);

	auto expr = to_expression(combined ? combined->image : VariableID(id));
	auto index = expr.find_first_of('[');

	// If an image is part of an argument buffer translate this to a legal identifier.
	string::size_type period = 0;
	while ((period = expr.find_first_of('.', period)) != string::npos && period < index)
		expr[period] = '_';

	if (index == string::npos)
		return expr + swizzle_name_suffix;
	else
	{
		auto image_expr = expr.substr(0, index);
		auto array_expr = expr.substr(index);
		return image_expr + swizzle_name_suffix + array_expr;
	}
}